

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjDecodeYUVPlanes(tjhandle handle,uchar **srcPlanes,int *strides,int subsamp,uchar *dstBuf,
                     int width,int pitch,int height,int pixelFormat,int flags)

{
  jpeg_decompress_struct *dinfo;
  __jmp_buf_tag *__env;
  int iVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  JDIMENSION JVar6;
  int iVar7;
  void *pvVar8;
  undefined8 *puVar9;
  char *pcVar10;
  void *pvVar11;
  void *pvVar12;
  uint uVar13;
  uint uVar14;
  int extraout_EDX;
  long lVar15;
  long lVar16;
  uchar *puVar17;
  JDIMENSION JVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uchar *_tmpbuf_aligned;
  long lVar22;
  uint uVar23;
  int *piVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  JDIMENSION outrow;
  JDIMENSION inrow;
  JSAMPROW *tmpbuf [10];
  JSAMPROW *inbuf [10];
  JSAMPLE *_tmpbuf [10];
  int pw [10];
  undefined4 local_190;
  undefined4 local_18c;
  long local_188;
  long local_180;
  void *local_178;
  __jmp_buf_tag *local_170;
  uchar **local_168;
  int *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  JDIMENSION aJStack_58 [10];
  
  if (handle == (tjhandle)0x0) {
    puVar9 = (undefined8 *)__tls_get_addr(&PTR_0019df20);
    *(undefined8 *)((long)puVar9 + 7) = 0x656c646e616820;
    *puVar9 = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  dinfo = (jpeg_decompress_struct *)((long)handle + 0x208);
  if ((*(byte *)((long)handle + 0x600) & 2) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjDecodeYUVPlanes(): Instance has not been initialized for decompression",0x49);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pvVar8 = (void *)__tls_get_addr(&PTR_0019df20);
    memcpy(pvVar8,"tjDecodeYUVPlanes(): Instance has not been initialized for decompression",0x49);
    uVar23 = 0xffffffff;
    pvVar8 = (void *)0x0;
    goto LAB_00139c1b;
  }
  if ((((((srcPlanes == (uchar **)0x0) || (0xb < (uint)pixelFormat)) || (height < 1)) ||
       ((pitch < 0 || (width < 1)))) ||
      ((dstBuf == (uchar *)0x0 || ((5 < (uint)subsamp || (*srcPlanes == (uchar *)0x0)))))) ||
     ((subsamp != 3 && ((srcPlanes[1] == (uchar *)0x0 || (srcPlanes[2] == (uchar *)0x0)))))) {
    builtin_strncpy((char *)((long)handle + 0x618),"s(): Inv",8);
    builtin_strncpy((char *)((long)handle + 0x620),"alid arg",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
    builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
    *(undefined8 *)((long)handle + 0x626) = 0x746e656d756772;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pcVar10 = (char *)__tls_get_addr(&PTR_0019df20);
    builtin_strncpy(pcVar10,"tjDecodeYUVPlanes(): Invalid argument",0x26);
LAB_00139c11:
    pvVar8 = (void *)0x0;
  }
  else {
    __env = (__jmp_buf_tag *)((long)handle + 0x528);
    local_168 = srcPlanes;
    local_160 = strides;
    iVar5 = _setjmp(__env);
    if (iVar5 == 0) {
      local_170 = __env;
      if (pixelFormat == 0xb) {
        builtin_strncpy((char *)((long)handle + 0x638),"to CMYK ",8);
        builtin_strncpy((char *)((long)handle + 0x640),"pixels.",8);
        builtin_strncpy((char *)((long)handle + 0x628),"de YUV i",8);
        builtin_strncpy((char *)((long)handle + 0x630),"mages in",8);
        builtin_strncpy((char *)((long)handle + 0x618),"s(): Can",8);
        builtin_strncpy((char *)((long)handle + 0x620),"not deco",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
        builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        pcVar10 = (char *)__tls_get_addr(&PTR_0019df20);
        builtin_strncpy(pcVar10,"tjDecodeYUVPlanes(): Cannot decode YUV images into CMYK pixels.",
                        0x40);
        goto LAB_00139c11;
      }
      if (pitch == 0) {
        pitch = tjPixelSize[(uint)pixelFormat] * width;
      }
      *(int *)((long)handle + 0x238) = width;
      *(int *)((long)handle + 0x23c) = height;
      if ((flags & 8U) == 0) {
        if ((flags & 0x10U) != 0) {
          pcVar10 = "JSIMD_FORCESSE=1";
          goto LAB_00139daa;
        }
        iVar5 = pitch;
        if ((flags & 0x20U) != 0) {
          pcVar10 = "JSIMD_FORCESSE2=1";
          goto LAB_00139daa;
        }
      }
      else {
        pcVar10 = "JSIMD_FORCEMMX=1";
LAB_00139daa:
        putenv(pcVar10);
        iVar5 = extraout_EDX;
      }
      *(undefined4 *)(*(long *)((long)handle + 0x448) + 0x20) = 0;
      *(undefined4 *)((long)handle + 0x340) = 0;
      *(undefined8 *)((long)handle + 0x414) = 0x3f00000000;
      *(undefined8 *)((long)handle + 0x41c) = 0;
      setDecodeDefaults(dinfo,subsamp,iVar5,0);
      puVar9 = *(undefined8 **)((long)handle + 0x450);
      local_158 = *puVar9;
      uStack_150 = puVar9[1];
      puVar9[1] = my_read_markers;
      *puVar9 = my_reset_marker_reader;
      jpeg_read_header(dinfo,1);
      puVar9 = *(undefined8 **)((long)handle + 0x450);
      *puVar9 = local_158;
      puVar9[1] = uStack_150;
      *(J_COLOR_SPACE *)((long)handle + 0x248) = pf2cs[(uint)pixelFormat];
      if (((uint)flags >> 0xb & 1) != 0) {
        *(undefined4 *)((long)handle + 0x268) = 1;
      }
      *(undefined4 *)((long)handle + 0x26c) = 0;
      *(undefined4 *)((long)handle + 0x418) = 0x3f;
      jinit_master_decompress(dinfo);
      (*(code *)**(undefined8 **)((long)handle + 0x468))(dinfo);
      iVar5 = *(int *)((long)handle + 0x3a4);
      uVar23 = -iVar5 & (height + iVar5) - 1U;
      if (pitch == 0) {
        pitch = tjPixelSize[(uint)pixelFormat] * *(int *)((long)handle + 0x290);
      }
      iVar1 = *(int *)((long)handle + 0x3a0);
      pvVar8 = malloc((long)(int)uVar23 << 3);
      if (pvVar8 == (void *)0x0) {
        builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
        builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
        builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
        builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
        builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        pcVar10 = (char *)__tls_get_addr(&PTR_0019df20);
        builtin_strncpy(pcVar10,"tjDecodeYUVPlanes(): Memory allocation failure",0x2f);
        pvVar8 = (void *)0x0;
        uVar23 = 0xffffffff;
      }
      else {
        if (0 < height) {
          uVar19 = 0;
          uVar21 = uVar19;
          do {
            uVar20 = uVar19;
            if ((flags & 2U) != 0) {
              uVar20 = (~uVar21 + (ulong)(uint)height) * (long)pitch;
            }
            *(uchar **)((long)pvVar8 + uVar21 * 8) = dstBuf + uVar20;
            uVar21 = uVar21 + 1;
            uVar19 = uVar19 + (long)pitch;
          } while ((uint)height != uVar21);
        }
        auVar4 = _DAT_00158050;
        auVar3 = _DAT_00158000;
        if (height < (int)uVar23) {
          uVar19 = (ulong)(uint)height;
          uVar13 = ~height + uVar23;
          auVar25._4_4_ = 0;
          auVar25._0_4_ = uVar13;
          auVar25._8_4_ = uVar13;
          auVar25._12_4_ = 0;
          uVar21 = 0;
          auVar25 = auVar25 ^ _DAT_00158050;
          do {
            auVar26._8_4_ = (int)uVar21;
            auVar26._0_8_ = uVar21;
            auVar26._12_4_ = (int)(uVar21 >> 0x20);
            auVar26 = (auVar26 | auVar3) ^ auVar4;
            uVar2 = *(undefined8 *)((long)pvVar8 + uVar19 * 8 + -8);
            if ((bool)(~(auVar26._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar26._0_4_ ||
                        auVar25._4_4_ < auVar26._4_4_) & 1)) {
              *(undefined8 *)((long)pvVar8 + uVar21 * 8 + uVar19 * 8) = uVar2;
            }
            if ((auVar26._12_4_ != auVar25._12_4_ || auVar26._8_4_ <= auVar25._8_4_) &&
                auVar26._12_4_ <= auVar25._12_4_) {
              *(undefined8 *)((long)pvVar8 + uVar21 * 8 + uVar19 * 8 + 8) = uVar2;
            }
            uVar21 = uVar21 + 2;
          } while (((ulong)uVar13 + 2 & 0xfffffffffffffffe) != uVar21);
        }
        local_180 = (long)*(int *)((long)handle + 0x240);
        local_178 = pvVar8;
        if (0 < local_180) {
          lVar22 = 0;
          do {
            local_188 = *(long *)((long)handle + 0x338);
            lVar15 = lVar22 * 0x60;
            uVar13 = *(int *)(local_188 + 0x1c + lVar15) * 8 + 0x1fU & 0xffffffe0;
            iVar7 = *(int *)(local_188 + 0xc + lVar15);
            pvVar11 = malloc((ulong)(iVar7 * uVar13 + 0x20));
            *(void **)(local_a8 + lVar22 * 8) = pvVar11;
            if (pvVar11 == (void *)0x0) {
LAB_0013a1fe:
              builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
              builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
              builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
              builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
              builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
              builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
              *(undefined4 *)((long)handle + 0x6d0) = 1;
              pcVar10 = (char *)__tls_get_addr(&PTR_0019df20);
              builtin_strncpy(pcVar10,"tjDecodeYUVPlanes(): Memory allocation failure",0x2f);
              goto LAB_00139c16;
            }
            pvVar12 = malloc((long)iVar7 * 8);
            *(void **)(local_148 + lVar22 * 8) = pvVar12;
            if (pvVar12 == (void *)0x0) goto LAB_0013a1fe;
            if (0 < iVar7) {
              uVar14 = 0;
              lVar16 = 0;
              do {
                *(ulong *)(*(long *)(local_148 + lVar22 * 8) + lVar16 * 8) =
                     (ulong)uVar14 + ((long)pvVar11 + 0x1fU & 0xffffffffffffffe0);
                lVar16 = lVar16 + 1;
                uVar14 = uVar14 + uVar13;
              } while (iVar7 != lVar16);
            }
            JVar6 = (int)(*(int *)(local_188 + lVar15 + 8) * (-iVar1 & (width + iVar1) - 1U)) /
                    iVar1;
            aJStack_58[lVar22] = JVar6;
            uVar21 = (long)(int)(iVar7 * uVar23) / (long)iVar5;
            iVar7 = (int)uVar21;
            pvVar11 = malloc((long)iVar7 << 3);
            *(void **)(local_f8 + lVar22 * 8) = pvVar11;
            if (pvVar11 == (void *)0x0) goto LAB_0013a1fe;
            if (0 < iVar7) {
              puVar17 = local_168[lVar22];
              uVar19 = 0;
              do {
                *(uchar **)((long)pvVar11 + uVar19 * 8) = puVar17;
                if ((local_160 == (int *)0x0) ||
                   (JVar18 = local_160[lVar22], local_160[lVar22] == 0)) {
                  JVar18 = JVar6;
                }
                puVar17 = puVar17 + (int)JVar18;
                uVar19 = uVar19 + 1;
              } while ((uVar21 & 0xffffffff) != uVar19);
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != local_180);
        }
        iVar5 = _setjmp(local_170);
        if (iVar5 == 0) {
          if (0 < (int)uVar23) {
            uVar21 = 0;
            do {
              local_18c = 0;
              local_190 = 0;
              iVar5 = (int)uVar21;
              if (0 < *(int *)((long)handle + 0x240)) {
                piVar24 = (int *)(*(long *)((long)handle + 0x338) + 0xc);
                uVar21 = 0;
                do {
                  jcopy_sample_rows(*(JSAMPARRAY *)(local_f8 + uVar21 * 8),
                                    (*piVar24 * iVar5) / *(int *)((long)handle + 0x3a4),
                                    *(JSAMPARRAY *)(local_148 + uVar21 * 8),0,*piVar24,
                                    aJStack_58[uVar21]);
                  uVar21 = uVar21 + 1;
                  piVar24 = piVar24 + 0x18;
                } while ((long)uVar21 < (long)*(int *)((long)handle + 0x240));
              }
              (**(code **)(*(long *)((long)handle + 0x468) + 8))
                        (dinfo,local_148,&local_18c,*(undefined4 *)((long)handle + 0x3a4),
                         (void *)((long)local_178 + (long)iVar5 * 8),&local_190,
                         *(undefined4 *)((long)handle + 0x3a4));
              uVar13 = iVar5 + *(int *)((long)handle + 0x3a4);
              uVar21 = (ulong)uVar13;
            } while ((int)uVar13 < (int)uVar23);
          }
          jpeg_abort_decompress(dinfo);
          uVar23 = 0;
        }
        else {
          uVar23 = 0xffffffff;
        }
      }
      goto LAB_00139c1b;
    }
    pvVar8 = (void *)0x0;
  }
LAB_00139c16:
  uVar23 = 0xffffffff;
LAB_00139c1b:
  if (200 < *(int *)((long)handle + 0x22c)) {
    jpeg_abort_decompress(dinfo);
  }
  free(pvVar8);
  lVar22 = 0;
  do {
    free(*(void **)(local_148 + lVar22 * 8));
    free(*(void **)(local_a8 + lVar22 * 8));
    free(*(void **)(local_f8 + lVar22 * 8));
    lVar22 = lVar22 + 1;
  } while (lVar22 != 10);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar23;
}

Assistant:

DLLEXPORT int tjDecodeYUVPlanes(tjhandle handle,
                                const unsigned char **srcPlanes,
                                const int *strides, int subsamp,
                                unsigned char *dstBuf, int width, int pitch,
                                int height, int pixelFormat, int flags)
{
  JSAMPROW *row_pointer = NULL;
  JSAMPLE *_tmpbuf[MAX_COMPONENTS];
  JSAMPROW *tmpbuf[MAX_COMPONENTS], *inbuf[MAX_COMPONENTS];
  int i, retval = 0, row, pw0, ph0, pw[MAX_COMPONENTS], ph[MAX_COMPONENTS];
  JSAMPLE *ptr;
  jpeg_component_info *compptr;
  int (*old_read_markers) (j_decompress_ptr);
  void (*old_reset_marker_reader) (j_decompress_ptr);

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  _tmpbuf[i] = NULL;  inbuf[i] = NULL;
  }

  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecodeYUVPlanes(): Instance has not been initialized for decompression");

  if (!srcPlanes || !srcPlanes[0] || subsamp < 0 || subsamp >= NUMSUBOPT ||
      dstBuf == NULL || width <= 0 || pitch < 0 || height <= 0 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF)
    THROW("tjDecodeYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!srcPlanes[1] || !srcPlanes[2]))
    THROW("tjDecodeYUVPlanes(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (pixelFormat == TJPF_CMYK)
    THROW("tjDecodeYUVPlanes(): Cannot decode YUV images into CMYK pixels.");

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];
  dinfo->image_width = width;
  dinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  dinfo->progressive_mode = dinfo->inputctl->has_multiple_scans = FALSE;
  dinfo->Ss = dinfo->Ah = dinfo->Al = 0;
  dinfo->Se = DCTSIZE2 - 1;
  if (setDecodeDefaults(dinfo, pixelFormat, subsamp, flags) == -1) {
    retval = -1;  goto bailout;
  }
  old_read_markers = dinfo->marker->read_markers;
  dinfo->marker->read_markers = my_read_markers;
  old_reset_marker_reader = dinfo->marker->reset_marker_reader;
  dinfo->marker->reset_marker_reader = my_reset_marker_reader;
  jpeg_read_header(dinfo, TRUE);
  dinfo->marker->read_markers = old_read_markers;
  dinfo->marker->reset_marker_reader = old_reset_marker_reader;

  this->dinfo.out_color_space = pf2cs[pixelFormat];
  if (flags & TJFLAG_FASTDCT) this->dinfo.dct_method = JDCT_FASTEST;
  dinfo->do_fancy_upsampling = FALSE;
  dinfo->Se = DCTSIZE2 - 1;
  jinit_master_decompress(dinfo);
  (*dinfo->upsample->start_pass) (dinfo);

  pw0 = PAD(width, dinfo->max_h_samp_factor);
  ph0 = PAD(height, dinfo->max_v_samp_factor);

  if (pitch == 0) pitch = dinfo->output_width * tjPixelSize[pixelFormat];

  if ((row_pointer = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph0)) == NULL)
    THROW("tjDecodeYUVPlanes(): Memory allocation failure");
  for (i = 0; i < height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = &dstBuf[(height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = &dstBuf[i * (size_t)pitch];
  }
  if (height < ph0)
    for (i = height; i < ph0; i++) row_pointer[i] = row_pointer[height - 1];

  for (i = 0; i < dinfo->num_components; i++) {
    compptr = &dinfo->comp_info[i];
    _tmpbuf[i] =
      (JSAMPLE *)malloc(PAD(compptr->width_in_blocks * DCTSIZE, 32) *
                        compptr->v_samp_factor + 32);
    if (!_tmpbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * compptr->v_samp_factor);
    if (!tmpbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < compptr->v_samp_factor; row++) {
      unsigned char *_tmpbuf_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf[i], 32);

      tmpbuf[i][row] =
        &_tmpbuf_aligned[PAD(compptr->width_in_blocks * DCTSIZE, 32) * row];
    }
    pw[i] = pw0 * compptr->h_samp_factor / dinfo->max_h_samp_factor;
    ph[i] = ph0 * compptr->v_samp_factor / dinfo->max_v_samp_factor;
    inbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i]);
    if (!inbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    ptr = (JSAMPLE *)srcPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      inbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < ph0; row += dinfo->max_v_samp_factor) {
    JDIMENSION inrow = 0, outrow = 0;

    for (i = 0, compptr = dinfo->comp_info; i < dinfo->num_components;
         i++, compptr++)
      jcopy_sample_rows(inbuf[i],
        row * compptr->v_samp_factor / dinfo->max_v_samp_factor, tmpbuf[i], 0,
        compptr->v_samp_factor, pw[i]);
    (dinfo->upsample->upsample) (dinfo, tmpbuf, &inrow,
                                 dinfo->max_v_samp_factor, &row_pointer[row],
                                 &outrow, dinfo->max_v_samp_factor);
  }
  jpeg_abort_decompress(dinfo);

bailout:
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  free(row_pointer);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(_tmpbuf[i]);
    free(inbuf[i]);
  }
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}